

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  pointer pcVar1;
  lts_20250127 *plVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  ssize_t sVar10;
  ostream *poVar11;
  char *pcVar12;
  size_t sVar13;
  int error;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  iterator iVar18;
  string_view sp;
  const_iterator other;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d9;
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  int local_9c;
  reference local_98;
  string *local_90;
  pointer local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_68;
  ByAnyChar local_60;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_40;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar6 = access((prefix->_M_dataplus)._M_p,0), iVar6 != -1)) {
      iVar18 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                        *)&this->files_);
      local_40.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            *)iVar18.node_;
      local_40.position_ = iVar18.position_;
      iVar18 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                      *)&this->files_);
      bVar4 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
              ::Equals(&local_40,(const_iterator)iVar18);
      if (bVar4) {
        return true;
      }
      local_9c = iVar18.position_;
      local_90 = prefix;
      local_68 = iVar18.node_;
      do {
        local_98 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                   ::operator*(&local_40);
        local_88 = (local_98->second)._M_dataplus._M_p;
        uVar16 = (uint)(local_98->second)._M_string_length;
        pcVar1 = (local_98->first)._M_dataplus._M_p;
        plVar2 = (lts_20250127 *)(local_98->first)._M_string_length;
        sp._M_str = "/\\";
        sp._M_len = 2;
        absl::lts_20250127::ByAnyChar::ByAnyChar(&local_60,sp);
        absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                  (&local_d8,plVar2,pcVar1,&local_60);
        absl::lts_20250127::strings_internal::
        Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::
        ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ::operator()(&local_80,&local_d9,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.delimiter_.delimiters_._M_dataplus._M_p !=
            &local_d8.delimiter_.delimiters_.field_2) {
          operator_delete(local_d8.delimiter_.delimiters_._M_dataplus._M_p,
                          local_d8.delimiter_.delimiters_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.delimiters_._M_dataplus._M_p != &local_60.delimiters_.field_2) {
          operator_delete(local_60.delimiters_._M_dataplus._M_p,
                          local_60.delimiters_.field_2._M_allocated_capacity + 1);
        }
        local_d8.text_._M_len = (size_t)&local_d8.delimiter_;
        pcVar1 = (local_90->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + local_90->_M_string_length);
        bVar4 = true;
        if ((long)local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20) {
          lVar15 = 8;
          uVar14 = 0;
          do {
            std::__cxx11::string::_M_append
                      ((char *)&local_d8,
                       *(ulong *)((long)local_80.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8));
            iVar6 = mkdir((char *)local_d8.text_._M_len,0x1ff);
            if ((iVar6 != 0) && (piVar9 = __errno_location(), *piVar9 != 0x11)) {
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(local_98->first)._M_dataplus._M_p,
                                   (local_98->first)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,": while trying to create directory ",0x23);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_d8.text_._M_len,(long)local_d8.text_._M_str
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
              pcVar12 = strerror(*piVar9);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
              }
              else {
                sVar13 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              bVar4 = false;
              break;
            }
            std::__cxx11::string::push_back((char)&local_d8);
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x20;
          } while (uVar14 < ((long)local_80.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_80.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        if ((ByAnyChar *)local_d8.text_._M_len != &local_d8.delimiter_) {
          operator_delete((void *)local_d8.text_._M_len,
                          (ulong)(local_d8.delimiter_.delimiters_._M_dataplus._M_p + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        if (bVar4 == false) {
          return false;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d8,local_90,&local_98->first);
        while (iVar6 = open((char *)local_d8.text_._M_len,0x241,0x1b6), iVar6 < 0) {
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          if (iVar6 != 4) {
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_d8.text_._M_len,
                                 (long)local_d8.text_._M_str);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
            pcVar12 = strerror(iVar6);
            std::operator<<(poVar11,pcVar12);
            goto LAB_00d4b84c;
          }
        }
        if (0 < (int)uVar16) {
          do {
            while( true ) {
              sVar10 = write(iVar6,local_88,(ulong)uVar16);
              uVar7 = (uint)sVar10;
              if (-1 < (int)uVar7) break;
              piVar9 = __errno_location();
              iVar8 = *piVar9;
              if (iVar8 != 4) {
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_d8.text_._M_len,
                                     (long)local_d8.text_._M_str);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": write: ",9);
                pcVar12 = strerror(iVar8);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar13 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
                }
                goto LAB_00d4b84c;
              }
            }
            if (uVar7 == 0) {
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_d8.text_._M_len,
                                   (long)local_d8.text_._M_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,": write() returned zero?",0x18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              goto LAB_00d4b84c;
            }
            local_88 = local_88 + (uVar7 & 0x7fffffff);
            uVar17 = uVar16 - uVar7;
            bVar5 = (int)uVar7 <= (int)uVar16;
            uVar16 = uVar17;
          } while (uVar17 != 0 && bVar5);
        }
        iVar8 = close(iVar6);
        pbVar3 = local_68;
        iVar6 = local_9c;
        if (iVar8 != 0) {
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(char *)local_d8.text_._M_len,
                               (long)local_d8.text_._M_str);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": close: ",9);
          pcVar12 = strerror(iVar6);
          std::operator<<(poVar11,pcVar12);
LAB_00d4b84c:
          if ((ByAnyChar *)local_d8.text_._M_len == &local_d8.delimiter_) {
            return false;
          }
          operator_delete((void *)local_d8.text_._M_len,
                          (ulong)(local_d8.delimiter_.delimiters_._M_dataplus._M_p + 1));
          return false;
        }
        if ((ByAnyChar *)local_d8.text_._M_len != &local_d8.delimiter_) {
          operator_delete((void *)local_d8.text_._M_len,
                          (ulong)(local_d8.delimiter_.delimiters_._M_dataplus._M_p + 1));
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::increment(&local_40);
        other.position_ = iVar6;
        other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                       *)pbVar3;
        other._12_4_ = 0;
        bVar5 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                ::Equals(&local_40,other);
        if (bVar5) {
          return bVar4;
        }
      } while( true );
    }
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
    piVar9 = __errno_location();
    pcVar12 = strerror(*piVar9);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}